

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type1Input.cpp
# Opt level: O3

void __thiscall Type1Input::~Type1Input(Type1Input *this)

{
  long *plVar1;
  long *plVar2;
  pointer pcVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  long lVar5;
  
  (this->super_Type1InterpreterImplementationAdapter).super_IType1InterpreterImplementation.
  _vptr_IType1InterpreterImplementation = (_func_int **)&PTR_Type1Hstem_003a8a40;
  FreeTables(this);
  InputPFBDecodeStream::~InputPFBDecodeStream(&this->mPFBDecoder);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Type1CharString>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Type1CharString>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Type1CharString>_>_>
  ::~_Rb_tree(&(this->mCharStrings)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>_>
  ::~_Rb_tree(&(this->mReverseEncoding)._M_t);
  lVar5 = 0x2240;
  do {
    plVar1 = (long *)((long)(this->mFontDictionary).FontMatrix + lVar5 + -0x30);
    plVar2 = *(long **)((long)(this->mFontDictionary).FontMatrix + lVar5 + -0x40);
    if (plVar1 != plVar2) {
      operator_delete(plVar2,*plVar1 + 1);
    }
    lVar5 = lVar5 + -0x20;
  } while (lVar5 != 0x240);
  Type1PrivateDictionary::~Type1PrivateDictionary(&this->mPrivateDictionary);
  Type1FontInfoDictionary::~Type1FontInfoDictionary(&this->mFontInfoDictionary);
  pcVar3 = (this->mFontDictionary).FontName._M_dataplus._M_p;
  paVar4 = &(this->mFontDictionary).FontName.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar4) {
    operator_delete(pcVar3,paVar4->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

Type1Input::~Type1Input(void)
{
	FreeTables();
}